

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python-puppet.hpp
# Opt level: O2

void henson::PythonPuppet::exec(void *self_)

{
  bool bVar1;
  time_type tVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  ulong uVar3;
  PythonPuppet *self;
  list argv;
  object local_98;
  object locals;
  object local_78;
  handle local_70;
  undefined1 local_68 [32];
  pybind11 local_48 [8];
  object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>> local_40 [8]
  ;
  object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>> local_38 [8]
  ;
  
  *(void **)((long)self_ + 0xb8) = self_;
  local_68._16_8_ = (long)self_ + 0x70;
  do {
    argv.super_object.super_handle.m_ptr = (object)(object)self_;
    pybind11::module_::import((module_ *)&local_98,"pyhenson");
    local_78.super_handle.m_ptr = (handle)(PyObject *)0x0;
    pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::operator=
              ((accessor<pybind11::detail::accessor_policies::str_attr> *)&locals,(long *)&argv);
    pybind11::object::~object(&local_78);
    pybind11::object::~object(&local_98);
    *(undefined1 *)((long)self_ + 0x20) = 1;
    tVar2 = get_time();
    *(time_type *)((long)self_ + 0x30) = tVar2;
    pybind11::list::list<long,_0>(&argv,0);
    pybind11::module_::import((module_ *)&locals,"sys");
    bVar1 = pybind11::hasattr(locals.super_handle.m_ptr,"argv");
    pybind11::object::~object(&locals);
    if (bVar1) {
      pybind11::module_::import((module_ *)local_68,"sys");
      local_78.super_handle.m_ptr = (handle)(PyObject *)0x0;
      pybind11::list::list<pybind11::detail::accessor_policies::str_attr>
                ((list *)&local_98,
                 (accessor<pybind11::detail::accessor_policies::str_attr> *)&locals);
      pybind11::object::operator=(&argv.super_object,&local_98);
      pybind11::object::~object(&local_98);
      pybind11::object::~object(&local_78);
      this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68;
    }
    else {
      pybind11::module_::import((module_ *)&locals,"sys");
      pybind11::module_::add_object
                ((module_ *)&locals,"argv",(handle)argv.super_object.super_handle.m_ptr,false);
      this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&locals;
    }
    pybind11::object::~object((object *)this);
    local_78.super_handle.m_ptr = (handle)(PyObject *)0x0;
    pybind11::detail::
    object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::
    operator()(local_38);
    pybind11::object::~object((object *)local_38);
    pybind11::object::~object(&local_78);
    for (uVar3 = 0;
        uVar3 < (ulong)(*(long *)((long)self_ + 0xa8) - *(long *)((long)self_ + 0xa0) >> 5);
        uVar3 = uVar3 + 1) {
      local_78.super_handle.m_ptr = (handle)(PyObject *)0x0;
      pybind11::detail::
      object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::
      operator()(local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &locals);
      pybind11::object::~object((object *)local_40);
      pybind11::object::~object(&local_78);
    }
    locals.super_handle.m_ptr = (handle)(PyObject *)0x0;
    pybind11::str::str((str *)(local_68 + 8),(string *)local_68._16_8_);
    pybind11::globals();
    local_70 = local_98.super_handle.m_ptr;
    local_98.super_handle.m_ptr = (handle)(PyObject *)0x0;
    local_68._24_8_ = locals.super_handle.m_ptr;
    if (locals.super_handle.m_ptr != (PyObject *)0x0) {
      *(long *)locals.super_handle.m_ptr = *(long *)locals.super_handle.m_ptr + 1;
    }
    pybind11::eval_file<(pybind11::eval_mode)2>
              (local_48,(str *)(local_68 + 8),(object *)&local_70,(object *)(local_68 + 0x18));
    pybind11::object::~object((object *)local_48);
    pybind11::object::~object((object *)(local_68 + 0x18));
    pybind11::object::~object((object *)&local_70);
    pybind11::object::~object(&local_98);
    pybind11::object::~object((object *)(local_68 + 8));
    pybind11::object::~object(&locals);
    pybind11::object::~object(&argv.super_object);
    *(undefined1 *)((long)self_ + 0x20) = 0;
    Coroutine<henson::PythonPuppet>::yield((Coroutine<henson::PythonPuppet> *)self_);
  } while( true );
}

Assistant:

static void         exec(void* self_)
    {
        PythonPuppet* self = (PythonPuppet*) self_;
        self->self = self;

        while(true)
        {
            {
                // we can have only one PythonPuppet (otherwise scoped_interpreter
                // will complain), so there is only one pyhenson module, with only
                // one self to modify
                py::module::import("pyhenson").attr("self") = reinterpret_cast<intptr_t>(self_);

                self->running_ = true;
                self->start_time_ = get_time();
                try
                {
                    py::list argv;
                    if (py::hasattr(py::module::import("sys"), "argv")) {
                        argv = py::module::import("sys").attr("argv");
                    } else {
                        py::module::import("sys").add_object("argv", argv);
                    }
                    argv.attr("clear")();
                    for(size_t i = 0; i < self->arguments_.size(); ++i)
                    {
                        auto& arg = self->arguments_[i];
                        argv.attr("append")(arg);
                    }

                    py::object locals;
                    py::eval_file(self->filename_, py::globals(), locals);
                } catch (const py::error_already_set& e)
                {
                    self->log_->info("Caught error_already_set (maybe SystemExit; check debug channel for details)");
                    self->log_->debug("  {}", e.what());
                }
                catch (const std::exception& e)
                {
                    self->log_->warn("Got exception from Python: {}", e.what());
                }
                self->running_ = false;
            }

            self->yield();      // the time for the final portion will get recorded thanks to this call
        }
    }